

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O3

void on_connect_with_close(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_30;
  long lStack_28;
  
  if ((uv_tcp_t *)req->handle == &tcp) {
    if (status != -0x6f) goto LAB_001844c4;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      uv_close(&tcp,on_close);
      return;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_001844c4:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  iVar3 = (int)&lStack_30;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  lStack_28 = (long)iVar1;
  lStack_30 = 0;
  if (lStack_28 == 0) {
    connection_fail(on_connect_without_close);
    lStack_28 = 1;
    lStack_30 = (long)timer_close_cb_calls;
    if (lStack_30 != 1) goto LAB_001845cb;
    lStack_28 = 1;
    lStack_30 = (long)timer_cb_calls;
    if (lStack_30 == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_28 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      lStack_30 = (long)iVar1;
      if (lStack_28 == lStack_30) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001845e5;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_001845cb:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_001845e5:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return;
}

Assistant:

static void on_connect_with_close(uv_connect_t *req, int status) {
  ASSERT_PTR_EQ((uv_stream_t*) &tcp, req->handle);
  ASSERT_EQ(status, UV_ECONNREFUSED);
  connect_cb_calls++;

  ASSERT_OK(close_cb_calls);
  uv_close((uv_handle_t*)req->handle, on_close);
}